

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O1

void av1_highbd_wiener_convolve_add_src_c
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,
               WienerConvolveParams *conv_params,int bd)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  char cVar4;
  byte bVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [12];
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  int k;
  undefined1 *puVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ushort *puVar22;
  bool bVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  undefined1 auVar28 [16];
  undefined1 auVar31 [16];
  undefined1 auStack_10738 [67336];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined2 uVar32;
  
  uVar13 = (uint)((ulong)filter_y >> 4) & 0xf;
  iVar11 = (int)((h + -1) * y_step_q4 + uVar13) >> 4;
  cVar4 = (char)bd;
  if (-8 < iVar11) {
    lVar19 = (long)(src + src_stride * -3) * 2 + -6;
    bVar5 = (byte)conv_params->round_0;
    uVar17 = ~(-1 << ((cVar4 - bVar5) + 8 & 0x1f));
    puVar16 = auStack_10738;
    iVar14 = 0;
    do {
      if (0 < w) {
        uVar21 = 0;
        uVar18 = (uint)((ulong)filter_x >> 4) & 0xf;
        do {
          lVar15 = lVar19 + (long)((int)uVar18 >> 4) * 2;
          iVar24 = 0;
          iVar25 = 0;
          iVar26 = 0;
          iVar27 = 0;
          lVar20 = 0;
          do {
            uVar1 = *(ulong *)(lVar15 + lVar20 * 2);
            auVar6._8_4_ = 0;
            auVar6._0_8_ = uVar1;
            auVar6._12_2_ = (short)(uVar1 >> 0x30);
            auVar7._8_2_ = (short)(uVar1 >> 0x20);
            auVar7._0_8_ = uVar1;
            auVar7._10_4_ = auVar6._10_4_;
            auVar9._6_8_ = 0;
            auVar9._0_6_ = auVar7._8_6_;
            auVar8._4_2_ = (short)(uVar1 >> 0x10);
            auVar8._0_4_ = (uint)uVar1;
            auVar8._6_8_ = SUB148(auVar9 << 0x40,6);
            uVar2 = *(ulong *)((ulong)((uVar18 & 0xf) << 4) + ((ulong)filter_x & 0xffffffffffffff00)
                              + lVar20 * 2);
            uVar32 = (undefined2)(uVar2 >> 0x30);
            auVar30._8_4_ = 0;
            auVar30._0_8_ = uVar2;
            auVar30._12_2_ = uVar32;
            auVar30._14_2_ = uVar32;
            uVar32 = (undefined2)(uVar2 >> 0x20);
            auVar29._12_4_ = auVar30._12_4_;
            auVar29._8_2_ = 0;
            auVar29._0_8_ = uVar2;
            auVar29._10_2_ = uVar32;
            auVar28._10_6_ = auVar29._10_6_;
            auVar28._8_2_ = uVar32;
            auVar28._0_8_ = uVar2;
            uVar32 = (undefined2)(uVar2 >> 0x10);
            auVar10._4_8_ = auVar28._8_8_;
            auVar10._2_2_ = uVar32;
            auVar10._0_2_ = uVar32;
            auVar31._0_4_ = (int)(short)uVar2;
            auVar31._4_4_ = auVar10._0_4_ >> 0x10;
            auVar31._8_4_ = auVar28._8_4_ >> 0x10;
            auVar31._12_4_ = auVar29._12_4_ >> 0x10;
            iVar24 = iVar24 + auVar31._0_4_ * ((uint)uVar1 & 0xffff);
            iVar25 = iVar25 + auVar8._4_4_ * auVar31._4_4_;
            iVar26 = iVar26 + (int)((auVar31._8_8_ & 0xffffffff) *
                                   ((ulong)auVar7._8_6_ & 0xffffffff));
            iVar27 = iVar27 + (auVar6._10_4_ >> 0x10) * auVar31._12_4_;
            lVar20 = lVar20 + 4;
          } while (lVar20 != 8);
          uVar12 = (int)((uint)*(ushort *)(lVar15 + 6) * 0x80 +
                         ((1 << (bVar5 & 0x1f)) >> 1) + (1 << (cVar4 + 6U & 0x1f)) +
                        iVar27 + iVar25 + iVar26 + iVar24) >> (bVar5 & 0x1f);
          uVar3 = uVar17;
          if ((int)uVar12 < (int)uVar17) {
            uVar3 = uVar12;
          }
          uVar32 = (undefined2)uVar3;
          if ((int)uVar12 < 0) {
            uVar32 = 0;
          }
          *(undefined2 *)(puVar16 + uVar21 * 2) = uVar32;
          uVar18 = uVar18 + x_step_q4;
          uVar21 = uVar21 + 1;
        } while (uVar21 != (uint)w);
      }
      lVar19 = lVar19 + src_stride * 2;
      puVar16 = puVar16 + 0x100;
      bVar23 = iVar14 != iVar11 + 7;
      iVar14 = iVar14 + 1;
    } while (bVar23);
  }
  if (0 < w) {
    bVar5 = (byte)conv_params->round_1;
    lVar19 = (long)dst * 2;
    puVar16 = auStack_10738;
    iVar11 = 0;
    do {
      if (0 < h) {
        uVar21 = 0;
        uVar17 = uVar13;
        do {
          lVar15 = (long)((int)uVar17 >> 4) * 0x100;
          puVar22 = (ushort *)(puVar16 + lVar15);
          lVar20 = 0;
          iVar14 = 0;
          do {
            iVar14 = iVar14 + (int)*(short *)((ulong)((uVar17 & 0xf) << 4) +
                                              ((ulong)filter_y & 0xffffffffffffff00) + lVar20 * 2) *
                              (uint)*puVar22;
            lVar20 = lVar20 + 1;
            puVar22 = puVar22 + 0x80;
          } while (lVar20 != 8);
          iVar14 = (int)((uint)*(ushort *)(puVar16 + lVar15 + 0x300) * 0x80 +
                         ((1 << (bVar5 & 0x1f)) >> 1) + (-1 << ((cVar4 + bVar5) - 1 & 0x1f)) +
                        iVar14) >> (bVar5 & 0x1f);
          if (bd == 10) {
            iVar24 = 0x3ff;
          }
          else if (bd == 0xc) {
            iVar24 = 0xfff;
          }
          else {
            iVar24 = 0xff;
          }
          if (iVar24 <= iVar14) {
            iVar14 = iVar24;
          }
          uVar32 = (undefined2)iVar14;
          if (iVar14 < 1) {
            uVar32 = 0;
          }
          *(undefined2 *)(lVar19 + uVar21 * dst_stride * 2) = uVar32;
          uVar17 = uVar17 + y_step_q4;
          uVar21 = uVar21 + 1;
        } while (uVar21 != (uint)h);
      }
      puVar16 = puVar16 + 2;
      lVar19 = lVar19 + 2;
      iVar11 = iVar11 + 1;
    } while (iVar11 != w);
  }
  return;
}

Assistant:

void av1_highbd_wiener_convolve_add_src_c(
    const uint8_t *src, ptrdiff_t src_stride, uint8_t *dst,
    ptrdiff_t dst_stride, const int16_t *filter_x, int x_step_q4,
    const int16_t *filter_y, int y_step_q4, int w, int h,
    const WienerConvolveParams *conv_params, int bd) {
  const InterpKernel *const filters_x = get_filter_base(filter_x);
  const int x0_q4 = get_filter_offset(filter_x, filters_x);

  const InterpKernel *const filters_y = get_filter_base(filter_y);
  const int y0_q4 = get_filter_offset(filter_y, filters_y);

  uint16_t temp[WIENER_MAX_EXT_SIZE * MAX_SB_SIZE];
  const int intermediate_height =
      (((h - 1) * y_step_q4 + y0_q4) >> SUBPEL_BITS) + SUBPEL_TAPS;

  assert(w <= MAX_SB_SIZE);
  assert(h <= MAX_SB_SIZE);
  assert(y_step_q4 <= 32);
  assert(x_step_q4 <= 32);
  assert(bd + FILTER_BITS - conv_params->round_0 + 2 <= 16);

  highbd_convolve_add_src_horiz_hip(src - src_stride * (SUBPEL_TAPS / 2 - 1),
                                    src_stride, temp, MAX_SB_SIZE, filters_x,
                                    x0_q4, x_step_q4, w, intermediate_height,
                                    conv_params->round_0, bd);
  highbd_convolve_add_src_vert_hip(
      temp + MAX_SB_SIZE * (SUBPEL_TAPS / 2 - 1), MAX_SB_SIZE, dst, dst_stride,
      filters_y, y0_q4, y_step_q4, w, h, conv_params->round_1, bd);
}